

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O0

string * __thiscall
cmCMakeHostSystemInformationCommand::ValueToString_abi_cxx11_
          (string *__return_storage_ptr__,cmCMakeHostSystemInformationCommand *this,size_t value)

{
  stringstream local_1a8 [8];
  stringstream tmp;
  undefined1 local_198 [376];
  ulong local_20;
  size_t value_local;
  cmCMakeHostSystemInformationCommand *this_local;
  
  local_20 = value;
  value_local = (size_t)this;
  this_local = (cmCMakeHostSystemInformationCommand *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::ostream::operator<<(local_198,local_20);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCMakeHostSystemInformationCommand
::ValueToString(size_t value) const
{
  std::stringstream tmp;
  tmp << value;
  return tmp.str();
}